

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

void * lj_mem_newgco(lua_State *L,MSize size)

{
  lua_State *L_00;
  undefined4 *puVar1;
  int in_ESI;
  long in_RDI;
  GCobj *o;
  global_State *g;
  
  L_00 = (lua_State *)(ulong)*(uint *)(in_RDI + 8);
  puVar1 = (undefined4 *)(*(code *)L_00->base)(L_00->top,0,0,in_ESI);
  if (puVar1 == (undefined4 *)0x0) {
    lj_err_mem(L_00);
  }
  (L_00->maxstack).ptr32 = in_ESI + (L_00->maxstack).ptr32;
  *puVar1 = *(undefined4 *)&L_00->cframe;
  *(int *)&L_00->cframe = (int)puVar1;
  *(byte *)(puVar1 + 1) = (byte)(L_00->openupval).gcptr32 & 3;
  return puVar1;
}

Assistant:

void * LJ_FASTCALL lj_mem_newgco(lua_State *L, MSize size)
{
  global_State *g = G(L);
  GCobj *o = (GCobj *)g->allocf(g->allocd, NULL, 0, size);
  if (o == NULL)
    lj_err_mem(L);
  lua_assert(checkptr32(o));
  g->gc.total += size;
  setgcrefr(o->gch.nextgc, g->gc.root);
  setgcref(g->gc.root, o);
  newwhite(g, o);
  return o;
}